

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O0

void initOptions(void)

{
  booleanOptionTags = (char **)malloc(0x30);
  booleanOptions = (int *)malloc(0x18);
  *booleanOptionTags = "sat";
  *booleanOptions = 0;
  booleanOptionTags[1] = "unsat";
  booleanOptions[1] = 0;
  booleanOptionTags[2] = "reorder";
  booleanOptions[2] = 1;
  booleanOptionTags[3] = "help";
  booleanOptions[3] = 0;
  booleanOptionTags[5] = "h";
  booleanOptions[5] = 0;
  booleanOptionTags[4] = "min-variables";
  booleanOptions[4] = 0;
  intOptionTags = (char **)malloc(0x10);
  intOptions = (int *)malloc(8);
  *intOptionTags = "n";
  *intOptions = 0;
  intOptionTags[1] = "s";
  intOptions[1] = 1;
  stringOptionTags = (char **)malloc(8);
  stringOptions = (char **)malloc(8);
  *stringOptionTags = "m";
  *stringOptions = (char *)0x0;
  return;
}

Assistant:

void initOptions()
{
    booleanOptionTags = (char **) malloc (MAX_BOOLEAN_OPTIONS*sizeof (char *));
    booleanOptions = (int *) malloc (MAX_BOOLEAN_OPTIONS*sizeof(int));

    booleanOptionTags[SAT] = "sat";
    booleanOptions[SAT] = 0;
    booleanOptionTags[UNSAT] = "unsat";
    booleanOptions[UNSAT] = 0;
    booleanOptionTags[REORDER] = "reorder";
    booleanOptions[REORDER] = 1;
    booleanOptionTags[HELP] = "help";
    booleanOptions[HELP] = 0;
    booleanOptionTags[HELP_SHORT] = "h";
    booleanOptions[HELP_SHORT] = 0;
    booleanOptionTags[MIN_VARIABLES] = "min-variables";
    booleanOptions[MIN_VARIABLES] = 0;

    intOptionTags = (char **) malloc (MAX_INT_OPTIONS*sizeof (char *));
    intOptions = (int *) malloc (MAX_INT_OPTIONS*sizeof(int));

    intOptionTags[NUM_VARIABLES] = "n";
    intOptions[NUM_VARIABLES] = 0;
    intOptionTags[RANDOM_SEED] = "s";
    intOptions[RANDOM_SEED] = 1;

    stringOptionTags = (char **) malloc (MAX_STRING_OPTIONS*sizeof (char *));
    stringOptions = (char **) malloc (MAX_STRING_OPTIONS*sizeof(char *));

    stringOptionTags[MODEL] = "m";
    stringOptions[MODEL] = NULL;

}